

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * generateblock(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff168;
  allocator<RPCArg> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  UniValue *in_stack_fffffffffffff170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff180;
  string *in_stack_fffffffffffff198;
  string *in_stack_fffffffffffff1a0;
  UniValue *in_stack_fffffffffffff1a8;
  char *in_stack_fffffffffffff1b0;
  undefined7 in_stack_fffffffffffff1b8;
  undefined1 in_stack_fffffffffffff1bf;
  string *in_stack_fffffffffffff1c0;
  undefined7 in_stack_fffffffffffff1c8;
  undefined1 in_stack_fffffffffffff1cf;
  undefined4 in_stack_fffffffffffff1d0;
  Type in_stack_fffffffffffff1d4;
  string *in_stack_fffffffffffff1d8;
  undefined4 in_stack_fffffffffffff1e0;
  Type in_stack_fffffffffffff1e4;
  undefined4 in_stack_fffffffffffff1e8;
  Type in_stack_fffffffffffff1ec;
  RPCArg *in_stack_fffffffffffff1f0;
  undefined1 *local_df8;
  RPCArgOptions *in_stack_fffffffffffff210;
  undefined1 *local_de0;
  undefined1 *local_dc8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  allocator<char> local_c3b;
  allocator<char> local_c3a [2];
  pointer local_c38;
  pointer fun;
  allocator<char> local_c1a;
  allocator<char> local_c19 [39];
  allocator<char> local_bf2;
  allocator<char> local_bf1 [31];
  allocator<char> local_bd2;
  allocator<char> local_bd1 [28];
  undefined1 local_bb5 [2];
  undefined1 local_bb3 [2];
  undefined1 local_bb1 [8];
  undefined1 local_ba9 [33];
  undefined1 local_b88 [7];
  allocator<char> local_b81 [8];
  allocator<char> local_b79 [31];
  allocator<char> local_b5a;
  allocator<char> local_b59 [289];
  undefined1 local_a38 [272];
  undefined1 local_928 [200];
  undefined1 local_860;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined1 local_820;
  undefined1 local_81f;
  allocator<RPCArg> local_720 [40];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0;
  undefined1 local_6df;
  undefined1 local_6d8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined1 local_697;
  undefined1 local_5f0 [264];
  undefined1 local_4e8 [160];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [528];
  RPCResults local_150 [11];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_b81[1] = (allocator<char>)0x0;
  local_b81[2] = (allocator<char>)0x0;
  local_b81[3] = (allocator<char>)0x0;
  local_b81[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff178,&in_stack_fffffffffffff170->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff180);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff168);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                 in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
                 in_stack_fffffffffffff1c0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_b88._0_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff178,&in_stack_fffffffffffff170->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  this_02 = (RPCHelpMan *)local_ba9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_bb1._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff178,&in_stack_fffffffffffff170->typ);
  name = (string *)local_bb1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_6d8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff180);
  local_6b0 = 0;
  uStack_6a8 = 0;
  local_6a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff168);
  local_698 = 0;
  local_697 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                 in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
                 in_stack_fffffffffffff1c0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8));
  description = (string *)(local_bb3 + 1);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff168);
  __l._M_len._0_7_ = in_stack_fffffffffffff1b8;
  __l._M_array = (iterator)in_stack_fffffffffffff1b0;
  __l._M_len._7_1_ = in_stack_fffffffffffff1bf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1a8,__l,
             (allocator_type *)in_stack_fffffffffffff1a0);
  local_720[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff180);
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6e8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff168);
  local_6e0 = 0;
  local_6df = 0;
  this = local_720;
  RPCArg::RPCArg(in_stack_fffffffffffff1f0,
                 (string *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8),
                 in_stack_fffffffffffff1e4,(Fallback *)in_stack_fffffffffffff1d8,
                 (string *)CONCAT44(in_stack_fffffffffffff1d4,in_stack_fffffffffffff1d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
                 in_stack_fffffffffffff210);
  results = local_150;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_bb3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_bb5[1] = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff1a8,(bool *)in_stack_fffffffffffff1a0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  examples = (RPCExamples *)local_bb5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_860 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff180);
  local_838 = 0;
  uStack_830 = 0;
  local_828 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_820 = 0;
  local_81f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                 in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d4,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
                 in_stack_fffffffffffff1c0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8));
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff1b8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff1b0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff1bf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1a8,__l_00,
             (allocator_type *)in_stack_fffffffffffff1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_c19[1] = (allocator<char>)0x0;
  local_c19[2] = (allocator<char>)0x0;
  local_c19[3] = (allocator<char>)0x0;
  local_c19[4] = (allocator<char>)0x0;
  local_c19[5] = (allocator<char>)0x0;
  local_c19[6] = (allocator<char>)0x0;
  local_c19[7] = (allocator<char>)0x0;
  local_c19[8] = (allocator<char>)0x0;
  local_c19[9] = (allocator<char>)0x0;
  local_c19[10] = (allocator<char>)0x0;
  local_c19[0xb] = (allocator<char>)0x0;
  local_c19[0xc] = (allocator<char>)0x0;
  local_c19[0xd] = (allocator<char>)0x0;
  local_c19[0xe] = (allocator<char>)0x0;
  local_c19[0xf] = (allocator<char>)0x0;
  local_c19[0x10] = (allocator<char>)0x0;
  local_c19[0x11] = (allocator<char>)0x0;
  local_c19[0x12] = (allocator<char>)0x0;
  local_c19[0x13] = (allocator<char>)0x0;
  local_c19[0x14] = (allocator<char>)0x0;
  local_c19[0x15] = (allocator<char>)0x0;
  local_c19[0x16] = (allocator<char>)0x0;
  local_c19[0x17] = (allocator<char>)0x0;
  local_c19[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1ec,
             (string *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff1d4,in_stack_fffffffffffff1d0),
             (bool)in_stack_fffffffffffff1cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  local_c38 = (pointer)0x0;
  fun = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8),
             in_stack_fffffffffffff1e4,in_stack_fffffffffffff1d8,
             SUB41(in_stack_fffffffffffff1d4 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff1cf,in_stack_fffffffffffff1c8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1c0,
             (bool)in_stack_fffffffffffff1bf);
  std::allocator<RPCResult>::allocator(this_00);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff1b8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff1b0;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff1bf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1a8,__l_01,
             (allocator_type *)in_stack_fffffffffffff1a0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1ec,
             (string *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
             in_stack_fffffffffffff1d8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff1d4,in_stack_fffffffffffff1d0),
             (bool)in_stack_fffffffffffff1cf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff1bf,in_stack_fffffffffffff1b8),in_stack_fffffffffffff1b0
             ,(allocator<char> *)in_stack_fffffffffffff1a8);
  HelpExampleCli(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
  std::operator+((char *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x132a71a);
  this_01 = (RPCArg *)&stack0xfffffffffffff3a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<generateblock()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff178,(anon_class_1_0_00000001 *)in_stack_fffffffffffff170);
  RPCHelpMan::RPCHelpMan(this_02,name,description,args,results,examples,(RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_c3b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_c3a);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff178);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_dc8 = local_928;
  do {
    local_dc8 = local_dc8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_dc8 != local_a38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff178);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_c1a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_c19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff178);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_bf2);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_bf1);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_bd2);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_bd1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff178);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_de0 = local_48;
  do {
    local_de0 = local_de0 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_de0 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_bb5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_bb3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff178);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_df8 = local_4e8;
  do {
    local_df8 = local_df8 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_df8 != local_5f0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_bb1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_ba9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ba9 + 0x20));
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b88 + 6));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_b81);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_b79);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_b5a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_b59);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan generateblock()
{
    return RPCHelpMan{"generateblock",
        "Mine a set of ordered transactions to a specified address or descriptor and return the block hash.",
        {
            {"output", RPCArg::Type::STR, RPCArg::Optional::NO, "The address or descriptor to send the newly generated bitcoin to."},
            {"transactions", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of hex strings which are either txids or raw transactions.\n"
                "Txids must reference transactions currently in the mempool.\n"
                "All transactions must be valid and in valid order, otherwise the block will be rejected.",
                {
                    {"rawtx/txid", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"submit", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether to submit the block before the RPC call returns or to return it as hex."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_HEX, "hash", "hash of generated block"},
                {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "hex of generated block, only present when submit=false"},
            }
        },
        RPCExamples{
            "\nGenerate a block to myaddress, with txs rawtx and mempool_txid\n"
            + HelpExampleCli("generateblock", R"("myaddress" '["rawtx", "mempool_txid"]')")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const auto address_or_descriptor = request.params[0].get_str();
    CScript coinbase_script;
    std::string error;

    if (!getScriptFromDescriptor(address_or_descriptor, coinbase_script, error)) {
        const auto destination = DecodeDestination(address_or_descriptor);
        if (!IsValidDestination(destination)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Error: Invalid address or descriptor");
        }

        coinbase_script = GetScriptForDestination(destination);
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    Mining& miner = EnsureMining(node);
    const CTxMemPool& mempool = EnsureMemPool(node);

    std::vector<CTransactionRef> txs;
    const auto raw_txs_or_txids = request.params[1].get_array();
    for (size_t i = 0; i < raw_txs_or_txids.size(); i++) {
        const auto& str{raw_txs_or_txids[i].get_str()};

        CMutableTransaction mtx;
        if (auto hash{uint256::FromHex(str)}) {
            const auto tx{mempool.get(*hash)};
            if (!tx) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Transaction %s not in mempool.", str));
            }

            txs.emplace_back(tx);

        } else if (DecodeHexTx(mtx, str)) {
            txs.push_back(MakeTransactionRef(std::move(mtx)));

        } else {
            throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("Transaction decode failed for %s. Make sure the tx has at least one input.", str));
        }
    }

    const bool process_new_block{request.params[2].isNull() ? true : request.params[2].get_bool()};
    CBlock block;

    ChainstateManager& chainman = EnsureChainman(node);
    {
        std::unique_ptr<BlockTemplate> block_template{miner.createNewBlock(coinbase_script, {.use_mempool = false})};
        CHECK_NONFATAL(block_template);

        block = block_template->getBlock();
    }

    CHECK_NONFATAL(block.vtx.size() == 1);

    // Add transactions
    block.vtx.insert(block.vtx.end(), txs.begin(), txs.end());
    RegenerateCommitments(block, chainman);

    {
        BlockValidationState state;
        if (!miner.testBlockValidity(block, /*check_merkle_root=*/false, state)) {
            throw JSONRPCError(RPC_VERIFY_ERROR, strprintf("testBlockValidity failed: %s", state.ToString()));
        }
    }

    std::shared_ptr<const CBlock> block_out;
    uint64_t max_tries{DEFAULT_MAX_TRIES};

    if (!GenerateBlock(chainman, miner, std::move(block), max_tries, block_out, process_new_block) || !block_out) {
        throw JSONRPCError(RPC_MISC_ERROR, "Failed to make block.");
    }

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("hash", block_out->GetHash().GetHex());
    if (!process_new_block) {
        DataStream block_ser;
        block_ser << TX_WITH_WITNESS(*block_out);
        obj.pushKV("hex", HexStr(block_ser));
    }
    return obj;
},
    };
}